

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIEnvironment::~CGUIEnvironment(CGUIEnvironment *this)

{
  ~CGUIEnvironment((CGUIEnvironment *)&this[-1].field_0x218,&VTT);
  operator_delete(&this[-1].field_0x218,0x220);
  return;
}

Assistant:

CGUIEnvironment::~CGUIEnvironment()
{
	clearDeletionQueue();

	if (HoveredNoSubelement && HoveredNoSubelement != this) {
		HoveredNoSubelement->drop();
		HoveredNoSubelement = 0;
	}

	if (Hovered && Hovered != this) {
		Hovered->drop();
		Hovered = 0;
	}

	if (Focus) {
		Focus->drop();
		Focus = 0;
	}

	if (ToolTip.Element) {
		ToolTip.Element->drop();
		ToolTip.Element = 0;
	}

	// drop skin
	if (CurrentSkin) {
		CurrentSkin->drop();
		CurrentSkin = 0;
	}

	u32 i;

	// delete all sprite banks
	for (i = 0; i < Banks.size(); ++i)
		if (Banks[i].Bank)
			Banks[i].Bank->drop();

	// delete all fonts
	for (i = 0; i < Fonts.size(); ++i)
		Fonts[i].Font->drop();

	if (Operator) {
		Operator->drop();
		Operator = 0;
	}

	if (FileSystem) {
		FileSystem->drop();
		FileSystem = 0;
	}

	if (Driver) {
		Driver->drop();
		Driver = 0;
	}
}